

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O1

void __thiscall floorplan::GraphStatistics::generateCategoryCountDist(GraphStatistics *this)

{
  double *pdVar1;
  mapped_type *pmVar2;
  GraphDatabase *pGVar3;
  ulong uVar4;
  AdjList *g;
  ulong uVar5;
  ulong uVar6;
  StoredVertex *sv;
  _List_node_base *p_Var7;
  floorplanGraph G;
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
  local_68;
  
  if ((this->_labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 1;
    uVar4 = 0;
    do {
      uVar5 = uVar6;
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node._M_size = 0;
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(8);
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           &(local_68.super_type.m_edges.
             super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
             ._M_impl._M_node.super__List_node_base._M_next)->_M_prev;
      (local_68.super_type.m_edges.
       super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)0x0;
      local_68.super_type.m_edges.
      super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
      ._M_impl._M_node._M_size =
           (size_t)local_68.super_type.m_edges.
                   super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[](&this->_categoryCountDistByLabel,
                            (this->_labels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar4);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(pmVar2,&local_68);
      if (local_68.super_type.m_edges.
          super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        operator_delete(local_68.super_type.m_edges.
                        super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        local_68.super_type.m_edges.
                        super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
                        ._M_impl._M_node._M_size -
                        (long)local_68.super_type.m_edges.
                              super__List_base<boost::list_edge<void_*,_spaceEdge>,_std::allocator<boost::list_edge<void_*,_spaceEdge>_>_>
                              ._M_impl._M_node.super__List_node_base._M_next);
      }
      uVar6 = (ulong)((int)uVar5 + 1);
      uVar4 = uVar5;
    } while (uVar5 < (ulong)((long)(this->_labels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_labels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pGVar3 = this->_database;
  if ((pGVar3->_graphs).
      super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pGVar3->_graphs).
      super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      boost::
      adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
      ::adjacency_list(&local_68,
                       (pGVar3->_graphs).
                       super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar6);
      for (p_Var7 = local_68.super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var7 != (_List_node_base *)&local_68.super_type.m_vertices; p_Var7 = p_Var7->_M_next) {
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](&this->_categoryCountDistByLabel,
                              (key_type *)&p_Var7[1]._M_next[1]._M_prev);
        pdVar1 = (pmVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *pdVar1 = *pdVar1 + 1.0;
      }
      boost::scoped_ptr<graphProperties>::~scoped_ptr(&local_68.m_property);
      boost::
      adj_list_impl<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
      ::~adj_list_impl(&local_68.super_type);
      pGVar3 = this->_database;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar4 = ((long)(pGVar3->_graphs).
                     super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pGVar3->_graphs).
                     super__Vector_base<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  return;
}

Assistant:

void GraphStatistics::generateCategoryCountDist(){
    for(unsigned int i = 0; i < _labels.size(); i++)
        _categoryCountDistByLabel[_labels[i]] = vector<double>(1, 0);

    /* Fill up the labels and categoryCount container */
    for (unsigned int i = 0; i < _database->getGraphs().size(); i++){
        floorplanGraph G = _database->getGraphs()[i];
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            _categoryCountDistByLabel[G[v].category][0]++;
        }
    }
}